

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O1

bool __thiscall
irr::scene::CAnimatedMeshSceneNode::setFrameLoop(CAnimatedMeshSceneNode *this,s32 begin,s32 end)

{
  int iVar1;
  s32 sVar2;
  s32 *psVar3;
  int iVar4;
  
  iVar1 = (*(this->Mesh->super_IMesh)._vptr_IMesh[10])();
  iVar1 = iVar1 + -1;
  sVar2 = begin;
  if (end < begin) {
    sVar2 = end;
  }
  if (begin < end) {
    begin = end;
  }
  iVar4 = 0;
  if (0 < sVar2) {
    iVar4 = sVar2;
  }
  if (iVar1 <= iVar4) {
    iVar4 = iVar1;
  }
  this->StartFrame = iVar4;
  if (iVar4 < begin) {
    iVar4 = begin;
  }
  if (iVar1 <= iVar4) {
    iVar4 = iVar1;
  }
  this->EndFrame = iVar4;
  psVar3 = &this->StartFrame;
  if ((float)this->FramesPerSecond <= 0.0 && (float)this->FramesPerSecond != 0.0) {
    psVar3 = &this->EndFrame;
  }
  (**(code **)(*(long *)this + 0x120))((float)*psVar3,this);
  return true;
}

Assistant:

bool CAnimatedMeshSceneNode::setFrameLoop(s32 begin, s32 end)
{
	const s32 maxFrameCount = Mesh->getFrameCount() - 1;
	if (end < begin) {
		StartFrame = core::s32_clamp(end, 0, maxFrameCount);
		EndFrame = core::s32_clamp(begin, StartFrame, maxFrameCount);
	} else {
		StartFrame = core::s32_clamp(begin, 0, maxFrameCount);
		EndFrame = core::s32_clamp(end, StartFrame, maxFrameCount);
	}
	if (FramesPerSecond < 0)
		setCurrentFrame((f32)EndFrame);
	else
		setCurrentFrame((f32)StartFrame);

	return true;
}